

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O2

void __thiscall Liby::EventQueue::EventQueue(EventQueue *this,Poller *poller)

{
  _Head_base<0UL,_Liby::FileDescriptor_*,_false> _Var1;
  int iVar2;
  Logger *pLVar3;
  int *piVar4;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  _Head_base<0UL,_Liby::FileDescriptor_*,_false> local_38;
  
  this->poller_ = poller;
  this->eventfd_ = -1;
  (this->eventfp_)._M_t.
  super___uniq_ptr_impl<Liby::FileDescriptor,_std::default_delete<Liby::FileDescriptor>_>._M_t.
  super__Tuple_impl<0UL,_Liby::FileDescriptor_*,_std::default_delete<Liby::FileDescriptor>_>.
  super__Head_base<0UL,_Liby::FileDescriptor_*,_false>._M_head_impl = (FileDescriptor *)0x0;
  (this->eventChanelPtr_)._M_t.
  super___uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>._M_t.
  super__Tuple_impl<0UL,_Liby::Channel_*,_std::default_delete<Liby::Channel>_>.
  super__Head_base<0UL,_Liby::Channel_*,_false>._M_head_impl = (Channel *)0x0;
  BlockingQueue<std::function<void_()>_>::BlockingQueue
            (&this->eventHandlers_,(initializer_list<std::function<void_()>_>)ZEXT816(0));
  if (this->poller_ == (Poller *)0x0) {
    pLVar3 = Logger::getLogger();
    Logger::log(pLVar3,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  }
  else {
    iVar2 = eventfd(1000,0x80800);
    this->eventfd_ = iVar2;
    if (-1 < iVar2) {
      std::make_unique<Liby::FileDescriptor,int&>((int *)&local_38);
      _Var1._M_head_impl = local_38._M_head_impl;
      local_38._M_head_impl = (FileDescriptor *)0x0;
      std::__uniq_ptr_impl<Liby::FileDescriptor,_std::default_delete<Liby::FileDescriptor>_>::reset
                ((__uniq_ptr_impl<Liby::FileDescriptor,_std::default_delete<Liby::FileDescriptor>_>
                  *)&this->eventfp_,_Var1._M_head_impl);
      std::unique_ptr<Liby::FileDescriptor,_std::default_delete<Liby::FileDescriptor>_>::~unique_ptr
                ((unique_ptr<Liby::FileDescriptor,_std::default_delete<Liby::FileDescriptor>_> *)
                 &local_38);
      FileDescriptor::set_noblock
                ((this->eventfp_)._M_t.
                 super___uniq_ptr_impl<Liby::FileDescriptor,_std::default_delete<Liby::FileDescriptor>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Liby::FileDescriptor_*,_std::default_delete<Liby::FileDescriptor>_>
                 .super__Head_base<0UL,_Liby::FileDescriptor_*,_false>._M_head_impl,true);
      std::make_unique<Liby::Channel,Liby::Poller*&,int&>((Poller **)&local_38,(int *)this);
      _Var1._M_head_impl = local_38._M_head_impl;
      local_38._M_head_impl = (FileDescriptor *)0x0;
      std::__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>::reset
                ((__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_> *)
                 &this->eventChanelPtr_,(pointer)_Var1._M_head_impl);
      std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::~unique_ptr
                ((unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_> *)&local_38);
      return;
    }
    pLVar3 = Logger::getLogger();
    piVar4 = __errno_location();
    strerror(*piVar4);
    Logger::log(pLVar3,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
  }
  exit(1);
}

Assistant:

EventQueue::EventQueue(Poller *poller) : poller_(poller) {
    fatalif(poller_ == nullptr, "Poller cannot be nullptr");
#ifdef __linux__
    eventfd_ = ::eventfd(1000, EFD_CLOEXEC | EFD_NONBLOCK);
    fatalif(eventfd_ < 0, "eventfd create: %s", ::strerror(errno));
    eventfp_ = std::make_unique<FileDescriptor>(eventfd_);
    eventfp_->set_noblock();
#elif defined(__APPLE__)
    int fds[2];
    if (::pipe(fds) < 0)
        fatal("pipe: %s", ::strerror(errno));
    eventfd_ = fds[0];
    event2fd_ = fds[1];
    eventfp_ = std::make_unique<FileDescriptor>(eventfd_);
    event2fp_ = std::make_unique<FileDescriptor>(event2fd_);
    eventfp_->set_noblock();
    event2fp_->set_noblock();
#endif
    eventChanelPtr_ = std::make_unique<Channel>(poller_, eventfd_);
}